

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdc.cpp
# Opt level: O0

void __thiscall
insyde_fdc_t::insyde_fdc_t
          (insyde_fdc_t *this,kstream *p__io,kstruct *p__parent,insyde_fdc_t *p__root)

{
  insyde_fdc_t *p__root_local;
  kstruct *p__parent_local;
  kstream *p__io_local;
  insyde_fdc_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__insyde_fdc_t_0026feb8;
  std::__cxx11::string::string((string *)&this->m_body);
  this->m__parent = p__parent;
  this->m__root = this;
  this->f_len_fdc_store_header = false;
  _read(this);
  return;
}

Assistant:

insyde_fdc_t::insyde_fdc_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, insyde_fdc_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    f_len_fdc_store_header = false;
    _read();
}